

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O1

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
               (ostream *s,abstract_message_chain_t *a,composed_action_name *other,
               type_index *other_1,intrusive_ptr_t<so_5::message_t> *other_2,chain_size *other_3)

{
  ostream *poVar1;
  type_index *ptVar2;
  composed_action_name name;
  
  ptVar2 = other_1;
  (*(a->super_abstract_message_box_t)._vptr_abstract_message_box_t[2])(a);
  std::__ostream_insert<char,std::char_traits<char>>(s,"[mchain_id=",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  name.m_2 = (char *)ptVar2;
  name.m_1 = other->m_2;
  make_trace_to_1((details *)s,(ostream *)other->m_1,name);
  make_trace_to<std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
            (s,other_1,other_2,other_3);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}